

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * __thiscall
fmt::v8::vformat_abi_cxx11_
          (string *__return_storage_ptr__,v8 *this,string_view fmt,format_args args)

{
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  basic_string_view<char> fmt_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  locale_ref local_290;
  unsigned_long_long local_288;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aStack_280;
  v8 *local_278;
  char *pcStack_270;
  allocator<char> local_249;
  undefined1 local_248 [8];
  memory_buffer buffer;
  format_args args_local;
  string_view fmt_local;
  
  buffer._528_8_ = fmt.size_;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,&local_249);
  std::allocator<char>::~allocator(&local_249);
  local_288._0_1_ = buffer.store_[0x1f0];
  local_288._1_1_ = buffer.store_[0x1f1];
  local_288._2_1_ = buffer.store_[0x1f2];
  local_288._3_1_ = buffer.store_[499];
  local_288._4_1_ = buffer.alloc_;
  local_288._5_3_ = buffer._533_3_;
  aStack_280 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
                )args.desc_;
  local_278 = this;
  pcStack_270 = fmt.data_;
  detail::locale_ref::locale_ref(&local_290);
  fmt_00.size_ = (size_t)pcStack_270;
  fmt_00.data_ = (char *)local_278;
  args_00.field_1.args_ = aStack_280.args_;
  args_00.desc_ = local_288;
  detail::vformat_to<char>((buffer<char> *)local_248,fmt_00,args_00,local_290);
  to_string<char,500ul>(__return_storage_ptr__,(v8 *)local_248,buf);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string vformat(string_view fmt, format_args args) {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}